

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_trie.hpp
# Opt level: O0

void __thiscall
poplar::
compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compact_fkhash_trie
          (compact_fkhash_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint32_t capa_bits,uint32_t symb_bits,uint32_t cht_capa_bits)

{
  undefined1 auVar1 [16];
  uint *puVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  uint32_t in_EDX;
  undefined8 *in_RDI;
  undefined1 auVar5 [16];
  compact_vector *in_stack_fffffffffffffe38;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *pcVar6;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_fffffffffffffe40;
  compact_vector *pcVar7;
  undefined8 in_stack_fffffffffffffe48;
  uint32_t uVar8;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined1 *init;
  size_p2 *this_00;
  compact_vector *this_01;
  uint32_t width;
  undefined8 *size;
  uint32_t in_stack_fffffffffffffee8;
  uint32_t in_stack_fffffffffffffeec;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_fffffffffffffef0;
  undefined1 local_90 [48];
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  size_p2 local_48 [2];
  size_p2 local_28;
  uint32_t local_10;
  uint local_c [3];
  
  uVar8 = (uint32_t)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_10 = in_EDX;
  bijective_hash::split_mix_hasher::split_mix_hasher((split_mix_hasher *)0x2262e6);
  width = (uint32_t)((ulong)(in_RDI + 3) >> 0x20);
  compact_vector::compact_vector((compact_vector *)in_stack_fffffffffffffe40);
  size = in_RDI + 9;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (in_stack_fffffffffffffe40);
  pcVar7 = (compact_vector *)(in_RDI + 0x1c);
  standard_hash_table<80U,_poplar::hash::vigna_hasher>::standard_hash_table
            ((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)in_stack_fffffffffffffe40);
  compact_vector::compact_vector((compact_vector *)in_stack_fffffffffffffe40);
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  size_p2::size_p2((size_p2 *)(in_RDI + 0x2b));
  size_p2::size_p2((size_p2 *)(in_RDI + 0x2d));
  puVar2 = std::max<unsigned_int>(&min_capa_bits,local_c);
  size_p2::size_p2(&local_28,*puVar2);
  in_RDI[0x2b] = local_28._0_8_;
  in_RDI[0x2c] = local_28.mask_;
  size_p2::size_p2(local_48,local_10);
  this_01 = (compact_vector *)(in_RDI + 0x2d);
  *(size_p2 *)(in_RDI + 0x2d) = local_48[0];
  this_00 = (size_p2 *)(in_RDI + 0x2b);
  uVar3 = size_p2::size(this_00);
  auVar1 = vcvtusi2sd_avx512f((undefined1  [16])local_48[0],uVar3 * 0x5a);
  auVar5._0_8_ = auVar1._0_8_ / 100.0;
  auVar5._8_8_ = auVar1._8_8_;
  uVar4 = vcvttsd2usi_avx512f(auVar5);
  in_RDI[0x2a] = uVar4;
  size_p2::bits(this_00);
  size_p2::bits((size_p2 *)this_01);
  bijective_hash::split_mix_hasher::split_mix_hasher
            ((split_mix_hasher *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),uVar8
            );
  in_RDI[2] = local_50;
  *in_RDI = local_60;
  in_RDI[1] = uStack_58;
  uVar3 = size_p2::size((size_p2 *)(in_RDI + 0x2b));
  uVar8 = (uint32_t)(uVar3 >> 0x20);
  size_p2::bits((size_p2 *)(in_RDI + 0x2d));
  compact_vector::compact_vector(pcVar7,(uint64_t)size,width);
  init = local_90;
  compact_vector::operator=((compact_vector *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  compact_vector::~compact_vector((compact_vector *)0x2264cc);
  size_p2::bits((size_p2 *)(in_RDI + 0x2b));
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
  pcVar6 = (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
           &stack0xfffffffffffffed8;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::operator=
            (in_stack_fffffffffffffe40,pcVar6);
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::~compact_hash_table
            ((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)0x226518);
  pcVar7 = (compact_vector *)(in_RDI + 0x2b);
  size_p2::size((size_p2 *)pcVar7);
  size_p2::bits((size_p2 *)pcVar7);
  size_p2::mask((size_p2 *)pcVar7);
  compact_vector::compact_vector(this_01,(uint64_t)this_00,uVar8,(uint64_t)init);
  compact_vector::operator=(pcVar7,(compact_vector *)pcVar6);
  compact_vector::~compact_vector((compact_vector *)0x226583);
  return;
}

Assistant:

compact_fkhash_trie(uint32_t capa_bits, uint32_t symb_bits, uint32_t cht_capa_bits = 0) {
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};
        symb_size_ = size_p2{symb_bits};
        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);
        hasher_ = Hasher{capa_size_.bits() + symb_size_.bits()};
        table_ = compact_vector{capa_size_.size(), symb_size_.bits() + dsp1_bits};
        aux_cht_ = aux_cht_type{capa_size_.bits(), cht_capa_bits};
        ids_ = compact_vector{capa_size_.size(), capa_size_.bits(), capa_size_.mask()};
    }